

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_1,_1> __thiscall
tcu::operator*(tcu *this,Matrix<float,_1,_2> *a,Matrix<float,_2,_1> *b)

{
  float fVar1;
  float *pfVar2;
  float (*pafVar3) [1];
  Vector<float,_1> extraout_XMM0_Da [1];
  int local_34;
  Vector<float,_1> local_30;
  int ndx;
  float v;
  int col;
  int row;
  Matrix<float,_2,_1> *b_local;
  Matrix<float,_1,_2> *a_local;
  Matrix<float,_1,_1> *res;
  
  Matrix<float,_1,_1>::Matrix((Matrix<float,_1,_1> *)this);
  local_30 = (float  [1])extraout_XMM0_Da[0].m_data[0];
  for (v = 0.0; (int)v < 1; v = (float)((int)v + 1)) {
    for (ndx = 0; ndx < 1; ndx = ndx + 1) {
      local_30.m_data[0] = (float  [1])0.0;
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        pfVar2 = Matrix<float,_1,_2>::operator()(a,(int)v,local_34);
        fVar1 = *pfVar2;
        pfVar2 = Matrix<float,_2,_1>::operator()(b,local_34,ndx);
        local_30.m_data[0] = (float  [1])(fVar1 * *pfVar2 + (float)local_30.m_data[0]);
      }
      pafVar3 = (float (*) [1])
                Matrix<float,_1,_1>::operator()((Matrix<float,_1,_1> *)this,(int)v,ndx);
      (*pafVar3)[0] = (float)local_30.m_data[0];
    }
  }
  return (Vector<tcu::Vector<float,_1>,_1>)(Vector<tcu::Vector<float,_1>,_1>)local_30.m_data[0];
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}